

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O2

void JsUtil::
     QuickSort<Memory::_no_write_barrier_policy,_char,_int_(*)(void_*,_const_void_*,_const_void_*)>
     ::Sort(char *base,size_t nmemb,size_t size,_func_int_void_ptr_void_ptr_void_ptr *comparer,
           void *context)

{
  char *pcVar1;
  char *b;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  size_t nmemb_00;
  char *pcVar10;
  char *local_38;
  
LAB_0039f03a:
  if (base != (char *)0x0) {
    if (9 < nmemb) goto code_r0x0039f051;
    if (nmemb - 2 < 8) {
      pcVar3 = base + size * 2;
      local_38 = pcVar3;
      switch(nmemb) {
      case 2:
        local_38 = base + size;
        iVar2 = (*comparer)(context,local_38,base);
        break;
      case 3:
        local_38 = base + size;
        iVar2 = (*comparer)(context,local_38,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,local_38,size);
        }
        iVar2 = (*comparer)(context,pcVar3,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar3,size);
        }
        goto LAB_0039ffc2;
      case 4:
        pcVar1 = base + size;
        iVar2 = (*comparer)(context,pcVar1,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
        }
        pcVar10 = base + size * 3;
        iVar2 = (*comparer)(context,pcVar10,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar3,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar3,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar3,pcVar1);
        base = pcVar1;
        break;
      case 5:
        pcVar7 = base + size;
        iVar2 = (*comparer)(context,pcVar7,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,size);
        }
        pcVar1 = base + size * 4;
        pcVar10 = base + size * 3;
        iVar2 = (*comparer)(context,pcVar1,pcVar10);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar1,size);
        }
        iVar2 = (*comparer)(context,pcVar1,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar1,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar10,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar3,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar3,size);
        }
        iVar2 = (*comparer)(context,pcVar1,pcVar7);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar1,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar7);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar10,size);
        }
        goto LAB_0039fa89;
      case 6:
        pcVar1 = base + size;
        iVar2 = (*comparer)(context,pcVar3,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar3,size);
        }
        iVar2 = (*comparer)(context,pcVar3,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar3,size);
        }
        iVar2 = (*comparer)(context,pcVar1,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
        }
        pcVar9 = base + size * 5;
        pcVar10 = base + size * 4;
        iVar2 = (*comparer)(context,pcVar9,pcVar10);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar9,size);
        }
        local_38 = base + size * 3;
        iVar2 = (*comparer)(context,pcVar9,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar9,size);
        }
        iVar2 = (*comparer)(context,pcVar10,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar10,size);
        }
        iVar2 = (*comparer)(context,local_38,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,local_38,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar9,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar9,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar10,size);
        }
        iVar2 = (*comparer)(context,local_38,pcVar1);
        pcVar7 = pcVar3;
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,local_38,size);
        }
        goto LAB_0039fa89;
      case 7:
        pcVar1 = base + size;
        iVar2 = (*comparer)(context,pcVar3,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar3,size);
        }
        iVar2 = (*comparer)(context,pcVar3,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar3,size);
        }
        iVar2 = (*comparer)(context,pcVar1,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
        }
        pcVar9 = base + size * 4;
        local_38 = base + size * 3;
        iVar2 = (*comparer)(context,pcVar9,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar9,size);
        }
        pcVar10 = base + size * 6;
        pcVar5 = base + size * 5;
        iVar2 = (*comparer)(context,pcVar10,pcVar5);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar5,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar9);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar5,pcVar9);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar9,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
        }
        iVar2 = (*comparer)(context,local_38,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,local_38,size);
        }
        iVar2 = (*comparer)(context,pcVar5,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar5,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar5,size);
        }
        iVar2 = (*comparer)(context,local_38,pcVar1);
        base = pcVar3;
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,local_38,size);
        }
        goto LAB_0039ffa1;
      case 8:
        pcVar1 = base + size;
        iVar2 = (*comparer)(context,pcVar1,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
        }
        pcVar10 = base + size * 3;
        iVar2 = (*comparer)(context,pcVar10,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar3,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar3,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar3,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar3,size);
        }
        pcVar9 = base + size * 5;
        local_38 = base + size * 4;
        iVar2 = (*comparer)(context,pcVar9,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar9,size);
        }
        pcVar5 = base + size * 7;
        pcVar7 = base + size * 6;
        iVar2 = (*comparer)(context,pcVar5,pcVar7);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar7,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar7,size);
        }
        iVar2 = (*comparer)(context,pcVar5,pcVar9);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar7,pcVar9);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar7,size);
        }
        iVar2 = (*comparer)(context,local_38,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,local_38,size);
        }
        iVar2 = (*comparer)(context,pcVar9,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar9,size);
        }
        iVar2 = (*comparer)(context,local_38,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,local_38,size);
        }
        iVar2 = (*comparer)(context,pcVar7,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar7,size);
        }
        iVar2 = (*comparer)(context,pcVar5,pcVar10);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar7,pcVar10);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar7,size);
        }
        iVar2 = (*comparer)(context,local_38,pcVar3);
        base = pcVar10;
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,local_38,size);
        }
LAB_0039ffa1:
        iVar2 = (*comparer)(context,pcVar9,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
        }
LAB_0039ffc2:
        iVar2 = (*comparer)(context,local_38,base);
        break;
      case 9:
        pcVar1 = base + size;
        iVar2 = (*comparer)(context,pcVar1,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
        }
        pcVar10 = base + size * 4;
        pcVar9 = base + size * 3;
        iVar2 = (*comparer)(context,pcVar10,pcVar9);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar10,size);
        }
        pcVar5 = base + size * 7;
        local_38 = base + size * 6;
        iVar2 = (*comparer)(context,pcVar5,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar3,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar3,size);
        }
        pcVar7 = base + size * 5;
        iVar2 = (*comparer)(context,pcVar7,pcVar10);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar7,size);
        }
        b = base + size * 8;
        iVar2 = (*comparer)(context,b,pcVar5);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,b,size);
        }
        iVar2 = (*comparer)(context,pcVar1,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar9);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar5,local_38);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(local_38,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar9,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
        }
        iVar2 = (*comparer)(context,local_38,pcVar9);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,local_38,size);
        }
        iVar2 = (*comparer)(context,pcVar9,base);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar5,pcVar10);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar5,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar7,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar7,size);
        }
        iVar2 = (*comparer)(context,b,pcVar7);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,b,size);
        }
        iVar2 = (*comparer)(context,pcVar7,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar7,size);
        }
        iVar2 = (*comparer)(context,pcVar9,pcVar1);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar9,size);
        }
        iVar2 = (*comparer)(context,pcVar5,pcVar7);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar5,size);
        }
        iVar2 = (*comparer)(context,local_38,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,local_38,size);
        }
        iVar2 = (*comparer)(context,local_38,pcVar10);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,local_38,size);
        }
        iVar2 = (*comparer)(context,pcVar10,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar10,size);
        }
        iVar2 = (*comparer)(context,pcVar9,pcVar3);
        if (iVar2 < 0) {
          QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar9,size);
        }
LAB_0039fa89:
        iVar2 = (*comparer)(context,local_38,pcVar7);
        base = pcVar7;
      }
      if (iVar2 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,local_38,size);
        return;
      }
    }
  }
  return;
code_r0x0039f051:
  pcVar3 = base + (nmemb >> 2) * size;
  iVar2 = (*comparer)(context,pcVar3,base);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar3,size);
  }
  uVar4 = (nmemb - 1) * size;
  pcVar1 = base + uVar4;
  pcVar10 = base + (nmemb * 3 >> 2) * size;
  iVar2 = (*comparer)(context,pcVar1,pcVar10);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar1,size);
  }
  uVar8 = (nmemb >> 1) * size;
  pcVar9 = base + uVar8;
  iVar2 = (*comparer)(context,pcVar1,pcVar9);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar1,size);
  }
  iVar2 = (*comparer)(context,pcVar10,pcVar9);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar10,size);
  }
  iVar2 = (*comparer)(context,pcVar10,base);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar10,size);
  }
  iVar2 = (*comparer)(context,pcVar9,base);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
  }
  iVar2 = (*comparer)(context,pcVar1,pcVar3);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar1,size);
  }
  iVar2 = (*comparer)(context,pcVar10,pcVar3);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar10,size);
  }
  iVar2 = (*comparer)(context,pcVar9,pcVar3);
  if (iVar2 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar3,pcVar9,size);
  }
  QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar9,size);
  nmemb_00 = 0;
  for (uVar6 = 0; uVar6 < uVar8; uVar6 = uVar6 + size) {
    iVar2 = (*comparer)(context,base + uVar6,pcVar1);
    if (iVar2 < 1) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                (base + uVar6,base + nmemb_00 * size,size);
      nmemb_00 = nmemb_00 + 1;
    }
  }
  for (; uVar6 < uVar4; uVar6 = uVar6 + size) {
    iVar2 = (*comparer)(context,base + uVar6,pcVar1);
    if (iVar2 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
                (base + uVar6,base + nmemb_00 * size,size);
      nmemb_00 = nmemb_00 + 1;
    }
  }
  QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base + nmemb_00 * size,pcVar1,size);
  Sort(base,nmemb_00,size,comparer,context);
  nmemb = nmemb - (nmemb_00 + 1);
  base = base + (nmemb_00 + 1) * size;
  goto LAB_0039f03a;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }